

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O0

void Rtm_PrintEdge(Rtm_Man_t *p,Rtm_Edg_t *pEdge)

{
  Rtm_Edg_t *pEdge_local;
  Rtm_Man_t *p_local;
  
  printf("%d : ",(ulong)(*(uint *)pEdge & 0xfff));
  printf("\n");
  return;
}

Assistant:

void Rtm_PrintEdge( Rtm_Man_t * p, Rtm_Edg_t * pEdge ) 
{
//    unsigned LData = pEdge->LData;
    printf( "%d : ", (int)pEdge->nLats );
/*
    if ( pEdge->nLats > 10 )
        Extra_PrintBinary( stdout, p->pExtra + pEdge->LData, 2*(pEdge->nLats+1) );
    else
        Extra_PrintBinary( stdout, &LData, 2*(pEdge->nLats+1) );
*/
    printf( "\n" );
}